

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
deqp::egl::anon_unknown_0::getDamageRegion
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Frame *frame)

{
  int *__args;
  pointer pDVar1;
  undefined8 in_RAX;
  long lVar2;
  size_t drawNdx;
  ulong uVar3;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 4;
  uVar3 = 0;
  __args = (int *)((long)&uStack_38 + 4);
  uStack_38 = in_RAX;
  while( true ) {
    pDVar1 = (frame->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(frame->draws).
                       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x18) <= uVar3)
    break;
    uStack_38 = CONCAT44(*(undefined4 *)((long)(pDVar1->rect).bottomLeft.m_data + lVar2 + -4),
                         (undefined4)uStack_38);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,__args);
    uStack_38 = CONCAT44(*(undefined4 *)((long)(pDVar1->rect).bottomLeft.m_data + lVar2),
                         (undefined4)uStack_38);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,__args);
    uStack_38 = CONCAT44(*(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar2 + 4) -
                         *(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar2 + -4),
                         (undefined4)uStack_38);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,__args);
    uStack_38 = CONCAT44(*(int *)((long)(pDVar1->rect).topRight.m_data + lVar2) -
                         *(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar2),
                         (undefined4)uStack_38);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,__args);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> getDamageRegion (const Frame& frame)
{
	vector<EGLint> damageRegion;
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& rect = frame.draws[drawNdx].rect;
		damageRegion.push_back(rect.bottomLeft.x());
		damageRegion.push_back(rect.bottomLeft.y());
		damageRegion.push_back(rect.topRight.x() - rect.bottomLeft.x());
		damageRegion.push_back(rect.topRight.y() - rect.bottomLeft.y());
	}

	DE_ASSERT(damageRegion.size() % 4 == 0);
	return damageRegion;
}